

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex_nivalis_conv.cpp
# Opt level: O2

string * nivalis::latex_to_nivalis(string *__return_storage_ptr__,string *expr_in)

{
  char cVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  string *psVar8;
  uint uVar9;
  size_t i;
  ulong uVar10;
  char cVar11;
  long lVar12;
  size_t i_1;
  char cVar13;
  long *in_FS_OFFSET;
  string_view src;
  string_view src_00;
  string_view src_01;
  string_view src_02;
  string_view src_03;
  string_view src_04;
  string_view src_05;
  string_view src_06;
  string_view src_07;
  string_view src_08;
  string_view src_09;
  string_view src_10;
  string_view src_11;
  string_view src_12;
  string_view src_13;
  initializer_list<char> __l;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_00;
  initializer_list<char> __l_01;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_02;
  initializer_list<char> __l_03;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_04;
  initializer_list<char> __l_05;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_06;
  initializer_list<char> __l_07;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_08;
  initializer_list<char> __l_09;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_10;
  initializer_list<char> __l_11;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_12;
  initializer_list<char> __l_13;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_14;
  string_view to;
  string_view to_00;
  string_view to_01;
  string_view to_02;
  string_view to_03;
  string_view to_04;
  string_view to_05;
  string_view to_06;
  string_view to_07;
  string_view to_08;
  string_view to_09;
  string_view to_10;
  string_view to_11;
  reference rVar14;
  string expr;
  string tmp_1;
  string tmp;
  ParenRuleOutputItem local_350;
  undefined4 local_328;
  undefined1 *local_320;
  undefined8 local_318;
  undefined1 local_310 [16];
  ParenRuleOutputItem local_300;
  string local_2d8;
  string *local_2b8;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((char)in_FS_OFFSET[-0x7c] == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(*in_FS_OFFSET + -0x430),"\\sqrt",(allocator<char> *)&tmp_1);
    expr._M_dataplus._M_p._0_2_ = 0x7b5b;
    psVar8 = &local_2d8;
    __l._M_len = 2;
    __l._M_array = (iterator)&expr;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(*in_FS_OFFSET + -0x410),__l,
               (allocator_type *)psVar8);
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              ((ParenRuleOutputItem *)&tmp,"(");
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem(&local_350,")^(1/(");
    local_320 = local_310;
    local_328 = 0;
    local_318 = 0;
    local_310[0] = 0;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem(&local_300,"))");
    __l_00._M_len = 5;
    __l_00._M_array = (iterator)&tmp;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)(*in_FS_OFFSET + -0x3f8),__l_00,(allocator_type *)psVar8);
    lVar12 = 0xa8;
    do {
      std::__cxx11::string::~string((string *)((long)&tmp._M_dataplus._M_p + lVar12));
      lVar12 = lVar12 + -0x28;
    } while (lVar12 != -0x20);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x430,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x7c) = 1;
  }
  if ((char)in_FS_OFFSET[-0x71] == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(*in_FS_OFFSET + -0x3d8),"\\sqrt",(allocator<char> *)&expr);
    tmp_1._M_dataplus._M_p._0_1_ = 0x7b;
    psVar8 = &local_2d8;
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&tmp_1;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(*in_FS_OFFSET + -0x3b8),__l_01,
               (allocator_type *)psVar8);
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              ((ParenRuleOutputItem *)&tmp,"sqrt(");
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem(&local_350,")");
    __l_02._M_len = 3;
    __l_02._M_array = (iterator)&tmp;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)(*in_FS_OFFSET + -0x3a0),__l_02,(allocator_type *)psVar8);
    lVar12 = 0x58;
    do {
      std::__cxx11::string::~string((string *)((long)&tmp._M_dataplus._M_p + lVar12));
      lVar12 = lVar12 + -0x28;
    } while (lVar12 != -0x20);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x3d8,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x71) = 1;
  }
  if ((char)in_FS_OFFSET[-0x66] == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(*in_FS_OFFSET + -0x380),"\\frac",(allocator<char> *)&tmp_1);
    expr._M_dataplus._M_p._0_2_ = 0x7b7b;
    psVar8 = &local_2d8;
    __l_03._M_len = 2;
    __l_03._M_array = (iterator)&expr;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(*in_FS_OFFSET + -0x360),__l_03,
               (allocator_type *)psVar8);
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              ((ParenRuleOutputItem *)&tmp,"((");
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem(&local_350,")/(");
    local_320 = local_310;
    local_328 = 1;
    local_318 = 0;
    local_310[0] = 0;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem(&local_300,"))");
    __l_04._M_len = 5;
    __l_04._M_array = (iterator)&tmp;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)(*in_FS_OFFSET + -0x348),__l_04,(allocator_type *)psVar8);
    lVar12 = 0xa8;
    do {
      std::__cxx11::string::~string((string *)((long)&tmp._M_dataplus._M_p + lVar12));
      lVar12 = lVar12 + -0x28;
    } while (lVar12 != -0x20);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x380,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x66) = 1;
  }
  if ((char)in_FS_OFFSET[-0x5b] == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(*in_FS_OFFSET + -0x328),"\\log_",(allocator<char> *)&tmp_1);
    expr._M_dataplus._M_p._0_2_ = 0x287b;
    psVar8 = &local_2d8;
    __l_05._M_len = 2;
    __l_05._M_array = (iterator)&expr;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(*in_FS_OFFSET + -0x308),__l_05,
               (allocator_type *)psVar8);
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              ((ParenRuleOutputItem *)&tmp,"log(");
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem(&local_350,", ");
    local_320 = local_310;
    local_328 = 0;
    local_318 = 0;
    local_310[0] = 0;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem(&local_300,")");
    __l_06._M_len = 5;
    __l_06._M_array = (iterator)&tmp;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)(*in_FS_OFFSET + -0x2f0),__l_06,(allocator_type *)psVar8);
    lVar12 = 0xa8;
    do {
      std::__cxx11::string::~string((string *)((long)&tmp._M_dataplus._M_p + lVar12));
      lVar12 = lVar12 + -0x28;
    } while (lVar12 != -0x20);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x328,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x5b) = 1;
  }
  if ((char)in_FS_OFFSET[-0x50] == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(*in_FS_OFFSET + -0x2d0),"\\sum_",(allocator<char> *)&tmp_1);
    expr._M_dataplus._M_p._0_2_ = 0x5e7b;
    psVar8 = &local_2d8;
    __l_07._M_len = 2;
    __l_07._M_array = (iterator)&expr;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(*in_FS_OFFSET + -0x2b0),__l_07,
               (allocator_type *)psVar8);
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              ((ParenRuleOutputItem *)&tmp,"sum(");
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem(&local_350,", ");
    local_320 = local_310;
    local_328 = 1;
    local_318 = 0;
    local_310[0] = 0;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem(&local_300,")\v");
    __l_08._M_len = 5;
    __l_08._M_array = (iterator)&tmp;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)(*in_FS_OFFSET + -0x298),__l_08,(allocator_type *)psVar8);
    lVar12 = 0xa8;
    do {
      std::__cxx11::string::~string((string *)((long)&tmp._M_dataplus._M_p + lVar12));
      lVar12 = lVar12 + -0x28;
    } while (lVar12 != -0x20);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x2d0,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x50) = 1;
  }
  if ((char)in_FS_OFFSET[-0x45] == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(*in_FS_OFFSET + -0x278),"\\prod_",(allocator<char> *)&tmp_1);
    expr._M_dataplus._M_p._0_2_ = 0x5e7b;
    psVar8 = &local_2d8;
    __l_09._M_len = 2;
    __l_09._M_array = (iterator)&expr;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(*in_FS_OFFSET + -600),__l_09,
               (allocator_type *)psVar8);
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              ((ParenRuleOutputItem *)&tmp,"prod(");
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem(&local_350,", ");
    local_320 = local_310;
    local_328 = 1;
    local_318 = 0;
    local_310[0] = 0;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem(&local_300,")\v");
    __l_10._M_len = 5;
    __l_10._M_array = (iterator)&tmp;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)(*in_FS_OFFSET + -0x240),__l_10,(allocator_type *)psVar8);
    lVar12 = 0xa8;
    do {
      std::__cxx11::string::~string((string *)((long)&tmp._M_dataplus._M_p + lVar12));
      lVar12 = lVar12 + -0x28;
    } while (lVar12 != -0x20);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x278,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x45) = 1;
  }
  if ((char)in_FS_OFFSET[-0x3a] == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(*in_FS_OFFSET + -0x220),"\\int_",(allocator<char> *)&tmp_1);
    expr._M_dataplus._M_p._0_2_ = 0x5e7b;
    psVar8 = &local_2d8;
    __l_11._M_len = 2;
    __l_11._M_array = (iterator)&expr;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(*in_FS_OFFSET + -0x200),__l_11,
               (allocator_type *)psVar8);
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              ((ParenRuleOutputItem *)&tmp,"int(");
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem(&local_350,", ");
    local_320 = local_310;
    local_328 = 1;
    local_318 = 0;
    local_310[0] = 0;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem(&local_300,")\v");
    __l_12._M_len = 5;
    __l_12._M_array = (iterator)&tmp;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)(*in_FS_OFFSET + -0x1e8),__l_12,(allocator_type *)psVar8);
    lVar12 = 0xa8;
    do {
      std::__cxx11::string::~string((string *)((long)&tmp._M_dataplus._M_p + lVar12));
      lVar12 = lVar12 + -0x28;
    } while (lVar12 != -0x20);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x220,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x3a) = 1;
  }
  if ((char)in_FS_OFFSET[-0x2f] == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(*in_FS_OFFSET + -0x1c8),"\\binom",(allocator<char> *)&tmp_1);
    expr._M_dataplus._M_p._0_2_ = 0x7b7b;
    psVar8 = &local_2d8;
    __l_13._M_len = 2;
    __l_13._M_array = (iterator)&expr;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(*in_FS_OFFSET + -0x1a8),__l_13,
               (allocator_type *)psVar8);
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              ((ParenRuleOutputItem *)&tmp,"choose(");
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem(&local_350,", ");
    local_320 = local_310;
    local_328 = 1;
    local_318 = 0;
    local_310[0] = 0;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem(&local_300,")");
    __l_14._M_len = 5;
    __l_14._M_array = (iterator)&tmp;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)(*in_FS_OFFSET + -400),__l_14,(allocator_type *)psVar8);
    lVar12 = 0xa8;
    do {
      std::__cxx11::string::~string((string *)((long)&tmp._M_dataplus._M_p + lVar12));
      lVar12 = lVar12 + -0x28;
    } while (lVar12 != -0x20);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x1c8,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x2f) = 1;
  }
  std::__cxx11::string::string((string *)&expr,(string *)expr_in);
  util::trim((util *)&expr,expr_in);
  if (expr._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&tmp);
    goto LAB_00111ec9;
  }
  if (5 < expr._M_string_length) {
    std::__cxx11::string::substr((ulong)&tmp,(ulong)&expr);
    bVar4 = std::operator==(&tmp,"\\text{");
    if (bVar4) {
      cVar13 = expr._M_dataplus._M_p[expr._M_string_length - 1];
      std::__cxx11::string::~string((string *)&tmp);
      if (cVar13 == '}') {
        std::__cxx11::string::substr((ulong)&tmp,(ulong)&expr);
        std::operator+(__return_storage_ptr__,"#",&tmp);
        std::__cxx11::string::~string((string *)&tmp);
        goto LAB_00111ec9;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&tmp);
    }
  }
  sVar3 = expr._M_string_length;
  _Var2._M_p = expr._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"\\left|",(allocator<char> *)&tmp_1);
  src._M_str = _Var2._M_p;
  src._M_len = sVar3;
  to._M_str = "abs(";
  to._M_len = 4;
  util::str_replace(&tmp,src,&local_50,to);
  std::__cxx11::string::operator=((string *)&expr,(string *)&tmp);
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::string::~string((string *)&local_50);
  sVar3 = expr._M_string_length;
  _Var2 = expr._M_dataplus;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"\\right|",(allocator<char> *)&tmp_1);
  src_00._M_str = _Var2._M_p;
  src_00._M_len = sVar3;
  to_00._M_str = ")";
  to_00._M_len = 1;
  util::str_replace(&tmp,src_00,&local_70,to_00);
  std::__cxx11::string::operator=((string *)&expr,(string *)&tmp);
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::string::~string((string *)&local_70);
  sVar3 = expr._M_string_length;
  _Var2 = expr._M_dataplus;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"\\lfloor",(allocator<char> *)&tmp_1);
  src_01._M_str = _Var2._M_p;
  src_01._M_len = sVar3;
  to_01._M_str = "floor(";
  to_01._M_len = 6;
  util::str_replace(&tmp,src_01,&local_90,to_01);
  std::__cxx11::string::operator=((string *)&expr,(string *)&tmp);
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::string::~string((string *)&local_90);
  sVar3 = expr._M_string_length;
  _Var2 = expr._M_dataplus;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"\\rfloor",(allocator<char> *)&tmp_1);
  src_02._M_str = _Var2._M_p;
  src_02._M_len = sVar3;
  to_02._M_str = ")";
  to_02._M_len = 1;
  util::str_replace(&tmp,src_02,&local_b0,to_02);
  std::__cxx11::string::operator=((string *)&expr,(string *)&tmp);
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::string::~string((string *)&local_b0);
  sVar3 = expr._M_string_length;
  _Var2 = expr._M_dataplus;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"\\lceil|",(allocator<char> *)&tmp_1);
  src_03._M_str = _Var2._M_p;
  src_03._M_len = sVar3;
  to_03._M_str = "ceil(";
  to_03._M_len = 5;
  util::str_replace(&tmp,src_03,&local_d0,to_03);
  std::__cxx11::string::operator=((string *)&expr,(string *)&tmp);
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::string::~string((string *)&local_d0);
  sVar3 = expr._M_string_length;
  _Var2 = expr._M_dataplus;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"\\rceil|",(allocator<char> *)&tmp_1);
  src_04._M_str = _Var2._M_p;
  src_04._M_len = sVar3;
  to_04._M_str = ")";
  to_04._M_len = 1;
  util::str_replace(&tmp,src_04,&local_f0,to_04);
  std::__cxx11::string::operator=((string *)&expr,(string *)&tmp);
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::string::~string((string *)&local_f0);
  sVar3 = expr._M_string_length;
  _Var2 = expr._M_dataplus;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"\\left",(allocator<char> *)&tmp_1);
  src_05._M_str = _Var2._M_p;
  src_05._M_len = sVar3;
  util::str_replace(&tmp,src_05,&local_110,(string_view)(ZEXT816(0x12e471) << 0x40));
  std::__cxx11::string::operator=((string *)&expr,(string *)&tmp);
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::string::~string((string *)&local_110);
  sVar3 = expr._M_string_length;
  _Var2 = expr._M_dataplus;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"\\right",(allocator<char> *)&tmp_1);
  src_06._M_str = _Var2._M_p;
  src_06._M_len = sVar3;
  util::str_replace(&tmp,src_06,&local_130,(string_view)(ZEXT816(0x12e471) << 0x40));
  std::__cxx11::string::operator=((string *)&expr,(string *)&tmp);
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::string::~string((string *)&local_130);
  sVar3 = expr._M_string_length;
  _Var2 = expr._M_dataplus;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"\\cdot",(allocator<char> *)&tmp_1);
  src_07._M_str = _Var2._M_p;
  src_07._M_len = sVar3;
  to_05._M_str = "*";
  to_05._M_len = 1;
  util::str_replace(&tmp,src_07,&local_150,to_05);
  std::__cxx11::string::operator=((string *)&expr,(string *)&tmp);
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::string::~string((string *)&local_150);
  sVar3 = expr._M_string_length;
  _Var2 = expr._M_dataplus;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"\\le",(allocator<char> *)&tmp_1);
  src_08._M_str = _Var2._M_p;
  src_08._M_len = sVar3;
  to_06._M_str = "<=";
  to_06._M_len = 2;
  util::str_replace(&tmp,src_08,&local_170,to_06);
  std::__cxx11::string::operator=((string *)&expr,(string *)&tmp);
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::string::~string((string *)&local_170);
  sVar3 = expr._M_string_length;
  _Var2 = expr._M_dataplus;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"\\ge",(allocator<char> *)&tmp_1);
  src_09._M_str = _Var2._M_p;
  src_09._M_len = sVar3;
  to_07._M_str = ">=";
  to_07._M_len = 2;
  util::str_replace(&tmp,src_09,&local_190,to_07);
  std::__cxx11::string::operator=((string *)&expr,(string *)&tmp);
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::string::~string((string *)&local_190);
  sVar3 = expr._M_string_length;
  _Var2 = expr._M_dataplus;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"\\ne",(allocator<char> *)&tmp_1);
  src_10._M_str = _Var2._M_p;
  src_10._M_len = sVar3;
  to_08._M_str = "!=";
  to_08._M_len = 2;
  util::str_replace(&tmp,src_10,&local_1b0,to_08);
  std::__cxx11::string::operator=((string *)&expr,(string *)&tmp);
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::string::~string((string *)&local_1b0);
  sVar3 = expr._M_string_length;
  _Var2 = expr._M_dataplus;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"\\operatorname{and}",(allocator<char> *)&tmp_1);
  src_11._M_str = _Var2._M_p;
  src_11._M_len = sVar3;
  to_09._M_str = "&";
  to_09._M_len = 1;
  util::str_replace(&tmp,src_11,&local_1d0,to_09);
  std::__cxx11::string::operator=((string *)&expr,(string *)&tmp);
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::string::~string((string *)&local_1d0);
  sVar3 = expr._M_string_length;
  _Var2 = expr._M_dataplus;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"\\operatorname{or}",(allocator<char> *)&tmp_1);
  src_12._M_str = _Var2._M_p;
  src_12._M_len = sVar3;
  to_10._M_str = "|";
  to_10._M_len = 1;
  util::str_replace(&tmp,src_12,&local_1f0,to_10);
  std::__cxx11::string::operator=((string *)&expr,(string *)&tmp);
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::string::~string((string *)&local_1f0);
  sVar3 = expr._M_string_length;
  _Var2 = expr._M_dataplus;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"\\operatorname{at}",(allocator<char> *)&tmp_1);
  src_13._M_str = _Var2._M_p;
  src_13._M_len = sVar3;
  to_11._M_str = "@";
  to_11._M_len = 1;
  util::str_replace(&tmp,src_13,&local_210,to_11);
  std::__cxx11::string::operator=((string *)&expr,(string *)&tmp);
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&tmp_1,
             "\\\\operatorname\\{(.+?)\\}",0x10);
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            (&tmp,&expr,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&tmp_1,"\\$1 ",0);
  std::__cxx11::string::operator=((string *)&expr,(string *)&tmp);
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&tmp_1);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&tmp_1,"\\\\text\\{(.+?)\\}",
             0x10);
  local_2b8 = __return_storage_ptr__;
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            (&tmp,&expr,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&tmp_1,"$1",0);
  std::__cxx11::string::operator=((string *)&expr,(string *)&tmp);
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&tmp_1);
  for (lVar12 = 0; lVar12 != 0x70; lVar12 = lVar12 + 8) {
    pcVar6 = (char *)strlen(*(char **)((long)latex_to_nivalis::SPECIAL_COMMANDS + lVar12));
    if (((pcVar6 < expr._M_string_length) && (*expr._M_dataplus._M_p == '\\')) &&
       (iVar5 = std::__cxx11::string::compare((ulong)&expr,1,pcVar6), iVar5 == 0)) {
      *expr._M_dataplus._M_p = '%';
    }
  }
  tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
  std::__cxx11::string::_M_construct((ulong)&tmp,'\x01');
  std::__cxx11::string::reserve((ulong)&tmp);
  for (uVar10 = 1; uVar10 < expr._M_string_length; uVar10 = uVar10 + 1) {
    cVar13 = (char)&tmp;
    if ((expr._M_dataplus._M_p[uVar10] != '{') &&
       ((expr._M_dataplus._M_p[uVar10 - 1] & 0xfeU) == 0x5e)) {
      std::__cxx11::string::push_back(cVar13);
      std::__cxx11::string::push_back(cVar13);
    }
    std::__cxx11::string::push_back(cVar13);
  }
  std::__cxx11::string::operator=((string *)&expr,(string *)&tmp);
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&tmp_1,
             "\\\\(sin|cos|tan)( *?)\\^\\{-1\\}",0x10);
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            (&tmp,&expr,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&tmp_1,"\\arc$1 ",0)
  ;
  std::__cxx11::string::operator=((string *)&expr,(string *)&tmp);
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&tmp_1);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&tmp_1,
             "\\\\frac\\{d\\}\\{d([a-zA-Z][a-zA-Z_0-9\\{\\}]*?)\\}",0x10);
  pcVar6 = "diff($1)\v";
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            (&tmp,&expr,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&tmp_1,"diff($1)\v",
             0);
  std::__cxx11::string::operator=((string *)&expr,(string *)&tmp);
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&tmp_1);
  lVar12 = *in_FS_OFFSET;
  anon_unknown_1::ParenRule::operator()(&local_2b0,(ParenRule *)(lVar12 + -0x328),&expr);
  anon_unknown_1::ParenRule::operator()(&local_290,(ParenRule *)(*in_FS_OFFSET + -0x430),&local_2b0)
  ;
  anon_unknown_1::ParenRule::operator()(&local_270,(ParenRule *)(lVar12 + -0x3d8),&local_290);
  anon_unknown_1::ParenRule::operator()(&local_250,(ParenRule *)(lVar12 + -0x2d0),&local_270);
  anon_unknown_1::ParenRule::operator()(&local_230,(ParenRule *)(lVar12 + -0x278),&local_250);
  anon_unknown_1::ParenRule::operator()(&local_2d8,(ParenRule *)(lVar12 + -0x220),&local_230);
  anon_unknown_1::ParenRule::operator()(&tmp_1,(ParenRule *)(lVar12 + -0x380),&local_2d8);
  anon_unknown_1::ParenRule::operator()(&tmp,(ParenRule *)(lVar12 + -0x1c8),&tmp_1);
  std::__cxx11::string::operator=((string *)&expr,(string *)&tmp);
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::string::~string((string *)&tmp_1);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  tmp_1._M_dataplus._M_p = (pointer)&tmp_1.field_2;
  pcVar7 = (char *)0x1;
  std::__cxx11::string::_M_construct((ulong)&tmp_1,'\x01');
  std::__cxx11::string::reserve((ulong)&tmp_1);
  cVar13 = *expr._M_dataplus._M_p;
  tmp._M_dataplus._M_p = (pointer)0x0;
  tmp._M_string_length = (ulong)tmp._M_string_length._4_4_ << 0x20;
  tmp.field_2._M_allocated_capacity = 0;
  tmp.field_2._8_4_ = 0;
  if (expr._M_string_length < 6) {
LAB_00111b14:
    if ((1 < expr._M_string_length) &&
       (pcVar6 = expr._M_dataplus._M_p, *expr._M_dataplus._M_p == '%')) {
      pcVar7 = (char *)std::__cxx11::string::find((char)&expr,0x20);
      pcVar6 = pcVar7;
      std::__cxx11::string::substr((ulong)&local_2d8,(ulong)&expr);
      goto LAB_00111b4e;
    }
  }
  else {
    pcVar6 = (char *)0x5;
    std::__cxx11::string::substr((ulong)&local_2d8,(ulong)&expr);
    bVar4 = std::operator==(&local_2d8,"%text");
    std::__cxx11::string::~string((string *)&local_2d8);
    if (!bVar4) goto LAB_00111b14;
    pcVar7 = (char *)std::__cxx11::string::find((char)&expr,0x40);
    pcVar6 = pcVar7;
    std::__cxx11::string::substr((ulong)&local_2d8,(ulong)&expr);
LAB_00111b4e:
    std::__cxx11::string::operator=((string *)&tmp_1,(string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    if (pcVar7 == (char *)0xffffffffffffffff) {
      pcVar7 = (char *)expr._M_string_length;
    }
  }
  lVar12 = 0;
  for (; pcVar7 < expr._M_string_length; pcVar7 = pcVar7 + 1) {
    cVar1 = expr._M_dataplus._M_p[(long)pcVar7];
    iVar5 = isspace((int)cVar1);
    cVar11 = (char)&tmp_1;
    if (iVar5 == 0) {
      if (cVar1 == '}') {
        pcVar6 = (char *)(ulong)(uint)tmp.field_2._8_4_;
        if (pcVar6 + (tmp.field_2._M_allocated_capacity - (long)tmp._M_dataplus._M_p) * 8 !=
            (char *)0x0) {
          rVar14 = std::vector<bool,_std::allocator<bool>_>::back
                             ((vector<bool,_std::allocator<bool>_> *)&tmp);
          lVar12 = lVar12 + -1 + (ulong)((rVar14._M_mask & *rVar14._M_p) == 0);
          bVar4 = tmp.field_2._8_4_ == 0;
          tmp.field_2._8_4_ = tmp.field_2._8_4_ + -1;
          if (bVar4) {
            tmp.field_2._8_4_ = 0x3f;
            tmp.field_2._M_allocated_capacity = tmp.field_2._M_allocated_capacity - 8;
          }
        }
      }
      else if (cVar1 == '{') {
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)&tmp,cVar13 == '_');
        rVar14 = std::vector<bool,_std::allocator<bool>_>::back
                           ((vector<bool,_std::allocator<bool>_> *)&tmp);
        lVar12 = (lVar12 + 1) - (ulong)((rVar14._M_mask & *rVar14._M_p) == 0);
      }
LAB_00111c30:
      uVar9 = (uint)cVar13;
      if (((expr._M_dataplus._M_p[(long)pcVar7] == '\\') &&
          (((pcVar6 = pcVar7 + 1, pcVar6 == (char *)expr._M_string_length ||
            (((expr._M_dataplus._M_p + 1)[(long)pcVar7] != ' ' &&
             ((expr._M_dataplus._M_p + 1)[(long)pcVar7] != '}')))) &&
           (bVar4 = latex_to_nivalis::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)(ulong)uVar9,'\0',true,SUB81(pcVar6,0)),
           !bVar4)))) ||
         ((((cVar13 == ')' || (cVar13 == '}')) || (cVar13 == ']')) &&
          (bVar4 = latex_to_nivalis::anon_class_1_0_00000001::operator()
                             ((anon_class_1_0_00000001 *)
                              (ulong)(uint)(int)expr._M_dataplus._M_p[(long)pcVar7],'\x01',false,
                              SUB81(pcVar6,0)), !bVar4)))) {
LAB_00111d3f:
        std::__cxx11::string::push_back(cVar11);
      }
      else {
        cVar1 = expr._M_dataplus._M_p[(long)pcVar7];
        if ((((cVar1 != '(') && (cVar1 != '{')) && (cVar1 != '[')) ||
           (bVar4 = latex_to_nivalis::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)(ulong)uVar9,'\0',true,SUB81(pcVar6,0)),
           bVar4)) {
          if (((lVar12 == 0) &&
              (bVar4 = util::is_identifier(expr._M_dataplus._M_p[(long)pcVar7]), bVar4)) &&
             ((cVar13 != '$' &&
              (((cVar13 != '@' && (bVar4 = util::is_identifier(cVar13), bVar4)) &&
               (bVar4 = (byte)(cVar13 - 0x30U) < 10, pcVar6 = (char *)(ulong)bVar4,
               (cVar13 == '.' || bVar4) !=
               (expr._M_dataplus._M_p[(long)pcVar7] == '.' ||
               (byte)(expr._M_dataplus._M_p[(long)pcVar7] - 0x30U) < 10))))))) goto LAB_00111d3f;
        }
        else {
          iVar5 = isalpha(uVar9);
          if ((iVar5 == 0) || (expr._M_dataplus._M_p[(long)pcVar7] != '(')) goto LAB_00111d3f;
        }
      }
      cVar13 = expr._M_dataplus._M_p[(long)pcVar7];
      if (cVar13 == '\v') {
        cVar13 = '\v';
      }
      else {
        std::__cxx11::string::push_back(cVar11);
      }
    }
    else {
      if (cVar1 == '\v') goto LAB_00111c30;
      std::__cxx11::string::push_back(cVar11);
    }
  }
  std::__cxx11::string::operator=((string *)&expr,(string *)&tmp_1);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)&tmp);
  std::__cxx11::string::~string((string *)&tmp_1);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&tmp_1,"_\\{(.+?)\\}\\*?",0x10)
  ;
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            (&tmp,&expr,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&tmp_1,"$1",0);
  __return_storage_ptr__ = local_2b8;
  std::__cxx11::string::operator=((string *)&expr,(string *)&tmp);
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&tmp_1);
  tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
  tmp._M_string_length = 0;
  tmp.field_2._M_allocated_capacity = tmp.field_2._M_allocated_capacity & 0xffffffffffffff00;
  std::__cxx11::string::reserve((ulong)&tmp);
  for (uVar10 = 0; uVar10 < expr._M_string_length; uVar10 = uVar10 + 1) {
    if (expr._M_dataplus._M_p[uVar10] != '\\') {
      std::__cxx11::string::push_back((char)&tmp);
    }
  }
  std::__cxx11::string::operator=((string *)&expr,(string *)&tmp);
  std::__cxx11::string::~string((string *)&tmp);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)expr._M_dataplus._M_p == &expr.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(expr.field_2._M_allocated_capacity._1_7_,expr.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = expr.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = expr._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(expr.field_2._M_allocated_capacity._1_7_,expr.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = expr._M_string_length;
  expr._M_string_length = 0;
  expr.field_2._M_local_buf[0] = '\0';
  expr._M_dataplus._M_p = (pointer)&expr.field_2;
LAB_00111ec9:
  std::__cxx11::string::~string((string *)&expr);
  return __return_storage_ptr__;
}

Assistant:

std::string latex_to_nivalis(const std::string& expr_in) {
#define NO_IMPLICIT_MULT "\v" // Special character used to indicate we should not add * here
    thread_local ParenRule
        l2n_nthroot { "\\sqrt", {'[', '{'},  // Input spec: prefix, paren types (end paren inferred)
            {"(", 1, ")^(1/(", 0, "))"} },   // Output spec: output arg order
        l2n_sqrt { "\\sqrt", {'{'},
            {"sqrt(", 0, ")"} },
        l2n_frac { "\\frac", {'{', '{'},
            {"((", 0, ")/(", 1, "))"} },
        l2n_logbase { "\\log_", {'{', '('},
            {"log(", 1, ", ", 0, ")"} },
        l2n_sum { "\\sum_", {'{', '^'},
            {"sum(", 0, ", ", 1, ")\v"} },
        l2n_prod { "\\prod_", {'{', '^'},
            {"prod(", 0, ", ", 1, ")\v"} },
        l2n_int { "\\int_", {'{', '^'},
            {"int(", 0, ", ", 1, ")\v"} },
        l2n_choose { "\\binom", {'{', '{'},
            {"choose(", 0, ", ", 1, ")"} };

    std::string expr = expr_in;
    util::trim(expr);
    if (expr.empty()) return "";
    if (expr.size() >= 6 && expr.substr(0, 6) == "\\text{" &&
           expr.back() == '}') {
        // Comment
        return "#" + expr.substr(6, expr.size() - 7);
    }

    expr = util::str_replace(expr, "\\left|", "abs(");
    expr = util::str_replace(expr, "\\right|", ")");
    expr = util::str_replace(expr, "\\lfloor", "floor(");
    expr = util::str_replace(expr, "\\rfloor", ")");
    expr = util::str_replace(expr, "\\lceil|", "ceil(");
    expr = util::str_replace(expr, "\\rceil|", ")");
    expr = util::str_replace(expr, "\\left", "");
    expr = util::str_replace(expr, "\\right", "");
    expr = util::str_replace(expr, "\\cdot", "*");
    expr = util::str_replace(expr, "\\le", "<=");
    expr = util::str_replace(expr, "\\ge", ">=");
    expr = util::str_replace(expr, "\\ne", "!=");
    expr = util::str_replace(expr, "\\operatorname{and}", "&");
    expr = util::str_replace(expr, "\\operatorname{or}", "|");
    expr = util::str_replace(expr, "\\operatorname{at}", "@");

    static const char*  SPECIAL_COMMANDS[] = {
        "poly", "fpoly", "Fpoly",
        "rect", "frect", "Frect",
        "circ", "fcirc", "Fcirc",
        "ellipse", "fellipse", "Fellipse",
        "text",
        "mandelbrot"
    };

    // Remove operatorname
    expr = std::regex_replace(expr,
            std::regex(R"(\\operatorname\{(.+?)\})"), "\\$1 ");

    // Remove text{}
    expr = std::regex_replace(expr,
            std::regex(R"(\\text\{(.+?)\})"), "$1");

    // Remap drawing commands
    for (size_t i = 0; i < sizeof(SPECIAL_COMMANDS) / sizeof(SPECIAL_COMMANDS[0]); ++i) {
        const size_t len = strlen(SPECIAL_COMMANDS[i]);
        if (expr.size() > len &&
                expr[0] == '\\' && expr.compare(1, len, SPECIAL_COMMANDS[i]) == 0) {
            expr[0] = '%';
        }
    }

    {
        std::string tmp(1, expr[0]);
        // Add braces so that x^22 -> x^{2}2,
        //                  log_22 -> log_{2}2
        tmp.reserve(expr.size());
        for (size_t i = 1; i < expr.size(); ++i) {
            if (expr[i] != '{' && (expr[i-1] == '_' || expr[i-1] == '^')) {
                tmp.push_back('{');
                tmp.push_back(expr[i]);
                tmp.push_back('}');
            } else {
                tmp.push_back(expr[i]);
            }
        }
        expr = std::move(tmp);
    }

    // Map (sin/cos/tan)^{-1} -> arg(..)
    expr = std::regex_replace(expr,
            std::regex(R"(\\(sin|cos|tan)( *?)\^\{-1\})"), "\\arc$1 ");

    // Diff
    expr = std::regex_replace(expr,
            std::regex(R"(\\frac\{d\}\{d([a-zA-Z][a-zA-Z_0-9\{\}]*?)\})"), "diff($1)" NO_IMPLICIT_MULT);

    // Apply parenthesis-based rules
    expr = l2n_choose(l2n_frac(l2n_int(
                    l2n_prod(l2n_sum(l2n_sqrt(
                                l2n_nthroot(l2n_logbase(expr))
                    )))
            )));

    // Implicit multiply
    {
        std::string tmp(1, expr[0]); tmp.reserve(expr.size());
        char last_nonspace = expr[0];
        std::vector<bool> brace_subs;
        size_t sub_level = 0; // subscript level

        auto is_opchar = [](char c, bool allow_open_brkt, bool allow_close_brkt) {
            return util::is_operator(c) ||
                util::is_control(c) ||
                (!allow_open_brkt && util::is_open_bracket(c)) ||
                (!allow_close_brkt && util::is_close_bracket(c)) ||
                c == '_' ||
                c == NO_IMPLICIT_MULT[0];
        };
        size_t i = 1;
        if (expr.size() > 5 && expr.substr(0, 5) == "%text") {
            i = expr.find('@');
            tmp = expr.substr(0, i);
            if (i == std::string::npos) i = expr.size();
        } else if (expr.size() > 1 && expr[0] == '%') {
            i = expr.find(' ');
            tmp = expr.substr(0, i);
            if (i == std::string::npos) i = expr.size();
        }
        for (; i < expr.size(); ++i) {
            if (std::isspace(expr[i]) && expr[i] != NO_IMPLICIT_MULT[0]) {
                tmp.push_back(expr[i]);
                continue;
            }
            if (expr[i] == '{') {
                brace_subs.push_back(last_nonspace == '_');
                if (brace_subs.back()) sub_level++;
            } else if (expr[i] == '}') {
                if (brace_subs.size()) {
                    if (brace_subs.back()) sub_level--;
                    brace_subs.pop_back();
                }
            }
            if ((expr[i] == '\\' &&
                    (i + 1 == expr.size() ||
                     (expr[i+1] != '}' && expr[i+1] != ' ')) && // not '\}' or '\ '
                    !is_opchar(last_nonspace, false, true)) ||
                (util::is_close_bracket(last_nonspace) &&
                    !is_opchar(expr[i], true, false))) {
                tmp.push_back('*');
            } else if (util::is_open_bracket(expr[i]) &&
                    !is_opchar(last_nonspace, false, true)){
                if (!std::isalpha(last_nonspace) || expr[i] != '(')  // not beginning of call
                    tmp.push_back('*');
            } else if (sub_level == 0 &&
                       util::is_identifier(expr[i]) && last_nonspace != '$' && last_nonspace != '@' &&
                       util::is_identifier(last_nonspace) &&
                       util::is_numeric(expr[i]) !=
                       util::is_numeric(last_nonspace)) {
                tmp.push_back('*');
            }
            last_nonspace = expr[i];
            if (expr[i] != NO_IMPLICIT_MULT[0])
                tmp.push_back(expr[i]);
        }
        expr = std::move(tmp);
    }

    // Subscript
    expr = std::regex_replace(expr,
            std::regex(R"(_\{(.+?)\}\*?)"), "$1");

    // Remove any remaining backslashes, convert {}
    {
        std::string tmp; tmp.reserve(expr.size());
        for (size_t i = 0; i < expr.size(); ++i) {
            if (expr[i] == '{' && (i == 0 || expr[i-1] != '\\')) {
                tmp.push_back('(');
            } else if (expr[i] == '}' && (i == 0 || expr[i-1] != '\\')) {
                tmp.push_back(')');
            } else if (expr[i] != '\\') {
                tmp.push_back(expr[i]);
            }
        }
        expr = std::move(tmp);
    }
    return expr;
}